

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleon.cxx
# Opt level: O0

double trento::anon_unknown_0::partonic_cross_section(VarMap *var_map)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  byte bVar4;
  _Ios_Openmode _Var5;
  _Setprecision _Var6;
  _Setw _Var7;
  double *pdVar8;
  int *piVar9;
  istream *piVar10;
  string *psVar11;
  ostream *poVar12;
  void *pvVar13;
  VarMap *in_RDI;
  fstream cache_write;
  fstream cache_read;
  path cache_path;
  path cache_dir;
  double sigma_partonic;
  double sigma_nn_;
  int constituent_number_;
  double constituent_width_;
  double nucleon_width_;
  double sigma_nn;
  int constituent_number;
  double constituent_width;
  double nucleon_width;
  string_type *in_stack_fffffffffffff818;
  variables_map *in_stack_fffffffffffff820;
  path *in_stack_fffffffffffff828;
  path *in_stack_fffffffffffff840;
  path *in_stack_fffffffffffff848;
  path *in_stack_fffffffffffff850;
  VarMap *var_map_00;
  VarMap *pVVar14;
  undefined1 local_5e8 [16];
  ostream local_5d8;
  int local_3d4;
  istream local_3d0 [592];
  path local_180 [4];
  double local_100;
  double local_f8;
  int local_ec;
  double local_e8;
  double local_e0;
  allocator local_d1;
  string local_d0 [32];
  VarMap *local_b0;
  allocator local_a1;
  string local_a0 [32];
  int local_80;
  allocator local_79;
  string local_78 [32];
  double local_58;
  allocator local_39;
  string local_38 [32];
  double local_18;
  VarMap *local_10;
  double local_8;
  
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"nucleon-width",&local_39);
  boost::program_options::variables_map::operator[]
            (in_stack_fffffffffffff820,in_stack_fffffffffffff818);
  pdVar8 = boost::program_options::variable_value::as<double>((variable_value *)0x13469e);
  dVar1 = *pdVar8;
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_18 = dVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"constit-width",&local_79);
  boost::program_options::variables_map::operator[]
            (in_stack_fffffffffffff820,in_stack_fffffffffffff818);
  pdVar8 = boost::program_options::variable_value::as<double>((variable_value *)0x134758);
  dVar1 = *pdVar8;
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  local_58 = dVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"constit-number",&local_a1);
  boost::program_options::variables_map::operator[]
            (in_stack_fffffffffffff820,in_stack_fffffffffffff818);
  piVar9 = boost::program_options::variable_value::as<int>((variable_value *)0x134812);
  iVar2 = *piVar9;
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  local_80 = iVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"cross-section",&local_d1);
  boost::program_options::variables_map::operator[]
            (in_stack_fffffffffffff820,in_stack_fffffffffffff818);
  pdVar8 = boost::program_options::variable_value::as<double>((variable_value *)0x1348c4);
  var_map_00 = (VarMap *)*pdVar8;
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  local_b0 = var_map_00;
  get_data_home();
  boost::filesystem::path::path(in_stack_fffffffffffff850,(value_type *)in_stack_fffffffffffff848);
  boost::filesystem::operator/(in_stack_fffffffffffff828,(path *)in_stack_fffffffffffff820);
  boost::filesystem::path::~path((path *)0x13495e);
  boost::filesystem::path::~path((path *)0x13496b);
  boost::filesystem::path::path(in_stack_fffffffffffff850,(value_type *)in_stack_fffffffffffff848);
  boost::filesystem::operator/(in_stack_fffffffffffff848,in_stack_fffffffffffff840);
  boost::filesystem::path::~path((path *)0x1349ad);
  boost::filesystem::create_directory((path *)0x1349ba);
  boost::filesystem::path::string_abi_cxx11_(local_180);
  boost::filesystem::path::path((path *)in_stack_fffffffffffff820,in_stack_fffffffffffff818);
  bVar3 = boost::filesystem::exists((path *)in_stack_fffffffffffff820);
  boost::filesystem::path::~path((path *)0x134a0d);
  if (bVar3) {
    psVar11 = boost::filesystem::path::string_abi_cxx11_(local_180);
    std::fstream::fstream(local_3d0,(string *)psVar11,_S_in);
    pVVar14 = local_10;
    do {
      bVar4 = std::ios::eof();
      if (((bVar4 ^ 0xff) & 1) == 0) {
        std::fstream::close();
        local_3d4 = 0;
        goto LAB_00134e0f;
      }
      piVar10 = (istream *)std::istream::operator>>(local_3d0,&local_ec);
      piVar10 = (istream *)std::istream::operator>>(piVar10,&local_e0);
      piVar10 = (istream *)std::istream::operator>>(piVar10,&local_e8);
      piVar10 = (istream *)std::istream::operator>>(piVar10,&local_f8);
      std::istream::operator>>(piVar10,&local_100);
      bVar3 = almost_equal(local_18,local_e0);
    } while ((((!bVar3) || (bVar3 = almost_equal(local_58,local_e8), !bVar3)) ||
             (bVar3 = almost_equal((double)local_b0,local_f8), !bVar3)) || (local_80 != local_ec));
    local_8 = local_100;
    local_3d4 = 1;
LAB_00134e0f:
    std::fstream::~fstream(local_3d0);
    local_10 = pVVar14;
    if (local_3d4 != 0) goto LAB_00135234;
  }
  psVar11 = boost::filesystem::path::string_abi_cxx11_(local_180);
  _Var5 = std::operator|(_S_out,_S_app);
  std::fstream::fstream(local_5e8,(string *)psVar11,_Var5);
  if (local_80 < 2) {
    local_100 = analytic_partonic_cross_section(var_map_00);
  }
  else {
    local_100 = numeric_partonic_cross_section(local_10);
  }
  _Var6 = std::setprecision(6);
  poVar12 = std::operator<<(&local_5d8,_Var6);
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,std::left);
  _Var7 = std::setw(4);
  poVar12 = std::operator<<(poVar12,_Var7);
  pvVar13 = (void *)std::ostream::operator<<(poVar12,std::fixed);
  pvVar13 = (void *)std::ostream::operator<<(pvVar13,local_80);
  poVar12 = (ostream *)std::ostream::operator<<(pvVar13,std::right);
  _Var7 = std::setw(10);
  poVar12 = std::operator<<(poVar12,_Var7);
  pvVar13 = (void *)std::ostream::operator<<(poVar12,std::fixed);
  pvVar13 = (void *)std::ostream::operator<<(pvVar13,local_18);
  poVar12 = (ostream *)std::ostream::operator<<(pvVar13,std::right);
  _Var7 = std::setw(10);
  poVar12 = std::operator<<(poVar12,_Var7);
  pvVar13 = (void *)std::ostream::operator<<(poVar12,std::fixed);
  pvVar13 = (void *)std::ostream::operator<<(pvVar13,local_58);
  poVar12 = (ostream *)std::ostream::operator<<(pvVar13,std::right);
  _Var7 = std::setw(10);
  poVar12 = std::operator<<(poVar12,_Var7);
  pvVar13 = (void *)std::ostream::operator<<(poVar12,std::fixed);
  pvVar13 = (void *)std::ostream::operator<<(pvVar13,(double)local_b0);
  poVar12 = (ostream *)std::ostream::operator<<(pvVar13,std::right);
  _Var7 = std::setw(0xe);
  poVar12 = std::operator<<(poVar12,_Var7);
  pvVar13 = (void *)std::ostream::operator<<(poVar12,std::scientific);
  pvVar13 = (void *)std::ostream::operator<<(pvVar13,local_100);
  std::ostream::operator<<(pvVar13,std::endl<char,std::char_traits<char>>);
  local_8 = local_100;
  local_3d4 = 1;
  std::fstream::~fstream(local_5e8);
LAB_00135234:
  boost::filesystem::path::~path((path *)0x135241);
  boost::filesystem::path::~path((path *)0x13524e);
  return local_8;
}

Assistant:

double partonic_cross_section(const VarMap& var_map) {
  // Read parameters from the configuration.
  auto nucleon_width = var_map["nucleon-width"].as<double>();
  auto constituent_width = var_map["constit-width"].as<double>();
  auto constituent_number = var_map["constit-number"].as<int>();
  auto sigma_nn = var_map["cross-section"].as<double>();

  // Cross section parameters
  double nucleon_width_;
  double constituent_width_;
  int constituent_number_;
  double sigma_nn_;
  double sigma_partonic;

  // Establish trento cache path
  auto cache_dir = get_data_home() / "trento";
  auto cache_path = cache_dir / "cross_section.cache";
  fs::create_directory(cache_dir);

  // Check if cache exists
  if (fs::exists(cache_path.string())){

    // Open cache read only
    std::fstream cache_read(cache_path.string(), std::ios_base::in);

    // Check cache for previously tabulated cross section parameters
    while(!cache_read.eof()) {
      cache_read >> constituent_number_ >> nucleon_width_ >>
        constituent_width_ >> sigma_nn_ >> sigma_partonic;
      if (almost_equal(nucleon_width, nucleon_width_) &&
          almost_equal(constituent_width, constituent_width_) &&
          almost_equal(sigma_nn, sigma_nn_) &&
          (constituent_number == constituent_number_)) {
        return sigma_partonic;
      }
    }

    // Close read-only file stream
    cache_read.close();
  }

  // Open cache with write access
  std::fstream cache_write(cache_path.string(),
      std::ios_base::out | std::ios_base::app);

  // Use numeric method to determine sigma_partonic if there is nucleon
  // substructure, otherwise use semi-analytic method.
  if (constituent_number > 1)
    sigma_partonic = numeric_partonic_cross_section(var_map);
  else
    sigma_partonic = analytic_partonic_cross_section(var_map);

  // Save new cross section parameters to cache
  using std::fixed;
  using std::setprecision;
  using std::setw;
  using std::scientific;
  using std::endl;

  cache_write << setprecision(6)
              << std::left << setw(4) << fixed << constituent_number
              << std::right << setw(10) << fixed << nucleon_width
              << std::right << setw(10) << fixed << constituent_width
              << std::right << setw(10) << fixed << sigma_nn
              << std::right << setw(14) << scientific << sigma_partonic
              << endl;

  return sigma_partonic;
}